

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int conv_num(char **buf,int *dest,int llim,int ulim)

{
  char *pcVar1;
  ulong uVar2;
  int rulim;
  char *pcVar3;
  int iVar4;
  
  if (0xf5 < (byte)(**buf - 0x3aU)) {
    iVar4 = 0;
    uVar2 = (ulong)(uint)ulim;
    pcVar1 = *buf;
    do {
      pcVar3 = pcVar1 + 1;
      *buf = pcVar3;
      iVar4 = (int)*pcVar1 + iVar4 * 10 + -0x30;
      if ((ulim < iVar4 * 10) || (0xffffffec < (int)uVar2 - 10U)) break;
      uVar2 = (long)(int)uVar2 / 10 & 0xffffffff;
      pcVar1 = pcVar3;
    } while ((byte)(*pcVar3 - 0x30U) < 10);
    if (iVar4 <= ulim && llim <= iVar4) {
      *dest = iVar4;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int conv_num(const char * *buf, int * dest, int llim, int ulim) {
	int result = 0;

	/* The limit also determines the number of valid digits. */
	int rulim = ulim;

	if (**buf < '0' || ** buf > '9') {
		return (0);
	}

	do {
		result *= 10;
		result += *(*buf)++ - '0';
		rulim /= 10;
	} while ((result * 10 <= ulim) && rulim && ** buf >= '0' && ** buf <= '9');

	if (result < llim || result > ulim) {
		return (0);
	}

	*dest = result;
	return (1);
}